

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O0

void __thiscall DPillar::Tick(DPillar *this)

{
  double dest;
  double dest_00;
  double oldceiling;
  double oldfloor;
  EMoveResult s;
  EMoveResult r;
  DPillar *this_local;
  
  dest = secplane_t::fD(&((this->super_DMover).super_DSectorEffect.m_Sector)->floorplane);
  dest_00 = secplane_t::fD(&((this->super_DMover).super_DSectorEffect.m_Sector)->ceilingplane);
  if (this->m_Type == pillarBuild) {
    oldfloor._4_4_ =
         sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                             this->m_FloorSpeed,this->m_FloorTarget,this->m_Crush,1,
                             (bool)(this->m_Hexencrush & 1));
    oldfloor._0_4_ =
         sector_t::MoveCeiling
                   ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                    this->m_CeilingSpeed,this->m_CeilingTarget,this->m_Crush,-1,
                    (bool)(this->m_Hexencrush & 1));
  }
  else {
    oldfloor._4_4_ =
         sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                             this->m_FloorSpeed,this->m_FloorTarget,this->m_Crush,-1,
                             (bool)(this->m_Hexencrush & 1));
    oldfloor._0_4_ =
         sector_t::MoveCeiling
                   ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                    this->m_CeilingSpeed,this->m_CeilingTarget,this->m_Crush,1,
                    (bool)(this->m_Hexencrush & 1));
  }
  if ((oldfloor._4_4_ == pastdest) && (oldfloor._0_4_ == pastdest)) {
    SN_StopSequence((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,1);
    (*(this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])();
  }
  else {
    if (oldfloor._4_4_ == crushed) {
      sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                          this->m_FloorSpeed,dest,-1,-1,(bool)(this->m_Hexencrush & 1));
    }
    if (oldfloor._0_4_ == crushed) {
      sector_t::MoveCeiling
                ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,this->m_CeilingSpeed,
                 dest_00,-1,1,(bool)(this->m_Hexencrush & 1));
    }
  }
  return;
}

Assistant:

void DPillar::Tick ()
{
	EMoveResult r, s;
	double oldfloor, oldceiling;

	oldfloor = m_Sector->floorplane.fD();
	oldceiling = m_Sector->ceilingplane.fD();

	if (m_Type == pillarBuild)
	{
		r = m_Sector->MoveFloor (m_FloorSpeed, m_FloorTarget, m_Crush, 1, m_Hexencrush);
		s = m_Sector->MoveCeiling (m_CeilingSpeed, m_CeilingTarget, m_Crush, -1, m_Hexencrush);
	}
	else
	{
		r = m_Sector->MoveFloor (m_FloorSpeed, m_FloorTarget, m_Crush, -1, m_Hexencrush);
		s = m_Sector->MoveCeiling (m_CeilingSpeed, m_CeilingTarget, m_Crush, 1, m_Hexencrush);
	}

	if (r == EMoveResult::pastdest && s == EMoveResult::pastdest)
	{
		SN_StopSequence (m_Sector, CHAN_FLOOR);
		Destroy ();
	}
	else
	{
		if (r == EMoveResult::crushed)
		{
			m_Sector->MoveFloor (m_FloorSpeed, oldfloor, -1, -1, m_Hexencrush);
		}
		if (s == EMoveResult::crushed)
		{
			m_Sector->MoveCeiling (m_CeilingSpeed, oldceiling, -1, 1, m_Hexencrush);
		}
	}
}